

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getaddrinfo.c
# Opt level: O3

ares_addrinfo_node * ares_append_addrinfo_node(ares_addrinfo_node **head)

{
  ares_addrinfo_node *paVar1;
  ares_addrinfo_node *paVar2;
  ares_addrinfo_node *paVar3;
  
  paVar2 = (ares_addrinfo_node *)ares_malloc_zero(0x28);
  if (paVar2 != (ares_addrinfo_node *)0x0) {
    paVar1 = *head;
    if (*head != (ares_addrinfo_node *)0x0) {
      do {
        paVar3 = paVar1;
        paVar1 = paVar3->ai_next;
      } while (paVar1 != (ares_addrinfo_node *)0x0);
      head = &paVar3->ai_next;
    }
    *head = paVar2;
  }
  return paVar2;
}

Assistant:

struct ares_addrinfo_node *
  ares_append_addrinfo_node(struct ares_addrinfo_node **head)
{
  struct ares_addrinfo_node *tail = ares_malloc_zero(sizeof(*tail));
  struct ares_addrinfo_node *last = *head;

  if (tail == NULL) {
    return NULL; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  if (!last) {
    *head = tail;
    return tail;
  }

  while (last->ai_next) {
    last = last->ai_next;
  }

  last->ai_next = tail;
  return tail;
}